

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::FunctionCallArgs(SQCompiler *this,bool rawcall)

{
  SQFuncState *this_00;
  SQInteger arg2;
  SQInteger arg1;
  SQInteger arg0;
  SQInteger closure;
  SQInteger stackbase;
  SQInteger i;
  SQInteger nargs;
  bool rawcall_local;
  SQCompiler *this_local;
  
  i = 1;
  while (this->_token != 0x29) {
    Expression(this);
    MoveIfCurrentTargetIsLocal(this);
    i = i + 1;
    if ((this->_token == 0x2c) && (Lex(this), this->_token == 0x29)) {
      Error(this,"expression expected, found \')\'");
    }
  }
  Lex(this);
  if (rawcall) {
    if (i < 3) {
      Error(this,"rawcall requires at least 2 parameters (callee and this)");
    }
    i = i + -2;
  }
  for (stackbase = 0; stackbase < i + -1; stackbase = stackbase + 1) {
    SQFuncState::PopTarget(this->_fs);
  }
  arg2 = SQFuncState::PopTarget(this->_fs);
  arg1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this->_fs,-1);
  SQFuncState::AddInstruction(this_00,_OP_CALL,arg0,arg1,arg2,i);
  return;
}

Assistant:

void FunctionCallArgs(bool rawcall = false)
    {
        SQInteger nargs = 1;//this
         while(_token != _SC(')')) {
             Expression();
             MoveIfCurrentTargetIsLocal();
             nargs++;
             if(_token == _SC(',')){
                 Lex();
                 if(_token == ')') Error(_SC("expression expected, found ')'"));
             }
         }
         Lex();
         if (rawcall) {
             if (nargs < 3) Error(_SC("rawcall requires at least 2 parameters (callee and this)"));
             nargs -= 2; //removes callee and this from count
         }
         for(SQInteger i = 0; i < (nargs - 1); i++) _fs->PopTarget();
         SQInteger stackbase = _fs->PopTarget();
         SQInteger closure = _fs->PopTarget();
         _fs->AddInstruction(_OP_CALL, _fs->PushTarget(), closure, stackbase, nargs);
    }